

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNIST.cpp
# Opt level: O1

void __thiscall MNIST::read_next(MNIST *this)

{
  undefined8 in_RAX;
  long lVar1;
  char label;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  std::istream::read((char *)this->images_,(long)this->buf_);
  lVar1 = -0x310;
  do {
    this->label_[lVar1] = (float)*(byte *)((long)this->data_ + lVar1) * 0.003921569;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  std::istream::read((char *)this->labels_,(long)&local_11);
  this->label_[0] = 0.0;
  this->label_[1] = 0.0;
  this->label_[2] = 0.0;
  this->label_[3] = 0.0;
  this->label_[4] = 0.0;
  this->label_[5] = 0.0;
  this->label_[6] = 0.0;
  this->label_[7] = 0.0;
  this->label_[8] = 0.0;
  this->label_[9] = 0.0;
  this->label_[local_11] = 1.0;
  return;
}

Assistant:

void MNIST::read_next()
{
    images_.read(buf_, DIM);
    num_t inv = num_t{1.0} / num_t{255.0};
    for (size_t i = 0; i != DIM; ++i)
    {
        data_[i] = static_cast<uint8_t>(buf_[i]) * inv;
    }

    char label;
    labels_.read(&label, 1);

    for (size_t i = 0; i != 10; ++i)
    {
        label_[i] = num_t{0.0};
    }
    label_[static_cast<uint8_t>(label)] = num_t{1.0};
}